

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeUpdateTabBar(ImGuiDockNode *node,ImGuiWindow *host_window)

{
  ushort uVar1;
  int iVar2;
  ImGuiWindow *window_00;
  float fVar3;
  ImGuiContext *pIVar4;
  ImGuiTabBarFlags IVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ImU32 col;
  ImGuiID IVar9;
  ImGuiDockNode *pIVar10;
  ImGuiWindow **ppIVar11;
  ImGuiTabItem *pIVar12;
  ImVec4 *pIVar13;
  bool bVar14;
  bool bVar15;
  ImVec4 IVar16;
  ImGuiWindow *local_210;
  byte local_1e9;
  bool *local_1e8;
  ImVec4 *local_1c0;
  ImGuiCol local_1b0;
  bool local_1a9;
  ImGuiWindow *local_1a8;
  bool local_19a;
  ImGuiTabItem *tab_1;
  ImGuiTabItem *tab;
  int iStack_180;
  bool held;
  ImGuiID title_bar_id;
  int n;
  ImVec4 local_16c;
  byte local_15a;
  byte local_159;
  int local_158;
  bool close_button_is_visible;
  bool close_button_is_enabled;
  int color_n_2;
  undefined4 uStack_14c;
  bool tab_open;
  undefined8 local_148;
  int local_140;
  uint local_13c;
  int color_n_1;
  ImGuiTabItemFlags tab_item_flags;
  ImGuiWindow *window_1;
  int window_n_1;
  int color_n;
  ImVec4 backup_style_cols [6];
  ImGuiTabBarFlags local_bc;
  int local_b8;
  ImGuiTabBarFlags tab_bar_flags;
  int tab_n_1;
  int tab_n;
  int tabs_unsorted_start;
  ImU32 title_bar_col;
  ImGuiWindow *window;
  int window_n;
  int tabs_count_old;
  ImVec2 close_button_pos;
  ImVec2 window_menu_button_pos;
  ImRect tab_bar_rect;
  ImRect title_bar_rect;
  ImGuiID tab_id;
  float fStack_58;
  bool has_window_menu_button;
  ImGuiDockNodeFlags node_flags;
  ImGuiID focus_tab_id;
  bool tab_bar_is_recreated;
  ImGuiTabBar *tab_bar;
  bool backup_skip_item;
  ImGuiDockNode *root_node;
  bool is_focused;
  ImGuiID closed_one;
  bool closed_all;
  bool node_was_active;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *host_window_local;
  ImGuiDockNode *node_local;
  
  pIVar4 = GImGui;
  bVar14 = node->LastFrameActive + 1 == GImGui->FrameCount;
  uVar1 = *(ushort *)&node->field_0xbc;
  local_19a = node->WantCloseTabId != 0 && bVar14;
  *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc & 0xbfff;
  node->WantCloseTabId = 0;
  bVar15 = false;
  pIVar10 = DockNodeGetRootNode(node);
  if (pIVar4->NavWindowingTarget == (ImGuiWindow *)0x0) {
    if (((pIVar4->NavWindow != (ImGuiWindow *)0x0) &&
        (pIVar4->NavWindow->RootWindowForTitleBarHighlight == host_window->RootWindowDockTree)) &&
       (pIVar10->LastFocusedNodeId == node->ID)) {
      bVar15 = true;
    }
  }
  else {
    bVar15 = pIVar4->NavWindowingTarget->DockNode == node;
  }
  bVar6 = ImGuiDockNode::IsHiddenTabBar(node);
  if ((bVar6) || (bVar6 = ImGuiDockNode::IsNoTabBar(node), bVar6)) {
    if ((node->Windows).Size < 1) {
      local_1a8 = (ImGuiWindow *)0x0;
    }
    else {
      ppIVar11 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,0);
      local_1a8 = *ppIVar11;
    }
    node->VisibleWindow = local_1a8;
    *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc & 0xfbff | (ushort)bVar15 << 10;
    if (bVar15 != false) {
      node->LastFrameFocused = pIVar4->FrameCount;
    }
    if (node->VisibleWindow != (ImGuiWindow *)0x0) {
      if ((bVar15 != false) || (pIVar10->VisibleWindow == (ImGuiWindow *)0x0)) {
        pIVar10->VisibleWindow = node->VisibleWindow;
      }
      if (node->TabBar != (ImGuiTabBar *)0x0) {
        node->TabBar->VisibleTabId = node->VisibleWindow->ID;
      }
    }
  }
  else {
    bVar6 = host_window->SkipItems;
    bVar7 = ImGuiDockNode::IsDockSpace(node);
    if (!bVar7) {
      host_window->SkipItems = false;
      (host_window->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
    }
    PushOverrideID(node->ID);
    _focus_tab_id = node->TabBar;
    bVar7 = _focus_tab_id == (ImGuiTabBar *)0x0;
    if (_focus_tab_id == (ImGuiTabBar *)0x0) {
      DockNodeAddTabBar(node);
      _focus_tab_id = node->TabBar;
    }
    fStack_58 = 0.0;
    *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc & 0xfbff | (ushort)bVar15 << 10;
    local_1a9 = false;
    if ((node->MergedFlags & 0x4000U) == 0) {
      local_1a9 = (pIVar4->Style).WindowMenuButtonPosition != -1;
    }
    title_bar_rect.Max.y._3_1_ = local_1a9;
    if ((local_1a9 != false) && (bVar8 = IsPopupOpen("#WindowMenu",0), bVar8)) {
      title_bar_rect.Max.x = (float)DockNodeUpdateWindowMenu(node,_focus_tab_id);
      if (title_bar_rect.Max.x != 0.0) {
        _focus_tab_id->NextSelectedTabId = (ImGuiID)title_bar_rect.Max.x;
        fStack_58 = title_bar_rect.Max.x;
      }
      bVar15 = bVar15 != false || ((byte)((ushort)*(undefined2 *)&node->field_0xbc >> 10) & 1) != 0;
    }
    ImRect::ImRect((ImRect *)&tab_bar_rect.Max);
    ImRect::ImRect((ImRect *)&window_menu_button_pos);
    ImVec2::ImVec2(&close_button_pos);
    ImVec2::ImVec2((ImVec2 *)&window_n);
    DockNodeCalcTabBarLayout
              (node,(ImRect *)&tab_bar_rect.Max,(ImRect *)&window_menu_button_pos,&close_button_pos,
               (ImVec2 *)&window_n);
    iVar2 = (_focus_tab_id->Tabs).Size;
    for (window._4_4_ = 0; window._4_4_ < (node->Windows).Size; window._4_4_ = window._4_4_ + 1) {
      ppIVar11 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,window._4_4_);
      window_00 = *ppIVar11;
      pIVar12 = TabBarFindTabByID(_focus_tab_id,window_00->ID);
      if (pIVar12 == (ImGuiTabItem *)0x0) {
        TabBarAddTab(_focus_tab_id,0x400000,window_00);
      }
    }
    if (bVar15 != false) {
      node->LastFrameFocused = pIVar4->FrameCount;
    }
    if ((host_window->Collapsed & 1U) == 0) {
      local_1b0 = 10;
      if (bVar15 != false) {
        local_1b0 = 0xb;
      }
    }
    else {
      local_1b0 = 0xc;
    }
    col = GetColorU32(local_1b0,1.0);
    ImDrawList::AddRectFilled
              (host_window->DrawList,&tab_bar_rect.Max,&title_bar_rect.Min,col,
               host_window->WindowRounding,0x30);
    if ((title_bar_rect.Max.y._3_1_ & 1) != 0) {
      IVar9 = ImGuiWindow::GetID(host_window,"#COLLAPSE",(char *)0x0);
      bVar8 = CollapseButton(IVar9,&close_button_pos,node);
      if (bVar8) {
        OpenPopup("#WindowMenu",0);
      }
      bVar8 = IsItemActive();
      if (bVar8) {
        fStack_58 = (float)_focus_tab_id->SelectedTabId;
      }
    }
    tab_n_1 = (_focus_tab_id->Tabs).Size;
    tab_bar_flags = (_focus_tab_id->Tabs).Size;
    while( true ) {
      tab_bar_flags = tab_bar_flags + -1;
      bVar8 = false;
      if (-1 < tab_bar_flags) {
        pIVar12 = ImVector<ImGuiTabItem>::operator[](&_focus_tab_id->Tabs,tab_bar_flags);
        bVar8 = (pIVar12->Flags & 0x400000U) != 0;
      }
      if (!bVar8) break;
      pIVar12 = ImVector<ImGuiTabItem>::operator[](&_focus_tab_id->Tabs,tab_bar_flags);
      pIVar12->Flags = pIVar12->Flags & 0xffbfffff;
      tab_n_1 = tab_bar_flags;
    }
    if (tab_n_1 < (_focus_tab_id->Tabs).Size) {
      for (local_b8 = tab_n_1; local_b8 < (_focus_tab_id->Tabs).Size; local_b8 = local_b8 + 1) {
      }
      if (tab_n_1 + 1 < (_focus_tab_id->Tabs).Size) {
        qsort((_focus_tab_id->Tabs).Data + tab_n_1,(long)((_focus_tab_id->Tabs).Size - tab_n_1),0x30
              ,TabItemComparerByDockOrder);
      }
    }
    if ((pIVar4->NavWindow != (ImGuiWindow *)0x0) &&
       (pIVar4->NavWindow->RootWindow->DockNode == node)) {
      _focus_tab_id->SelectedTabId = pIVar4->NavWindow->RootWindow->ID;
    }
    if ((bVar7) &&
       (pIVar12 = TabBarFindTabByID(_focus_tab_id,node->SelectedTabId),
       pIVar12 != (ImGuiTabItem *)0x0)) {
      IVar9 = node->SelectedTabId;
      _focus_tab_id->NextSelectedTabId = IVar9;
      _focus_tab_id->SelectedTabId = IVar9;
    }
    else if (iVar2 < (_focus_tab_id->Tabs).Size) {
      pIVar12 = ImVector<ImGuiTabItem>::back(&_focus_tab_id->Tabs);
      IVar9 = pIVar12->Window->ID;
      _focus_tab_id->NextSelectedTabId = IVar9;
      _focus_tab_id->SelectedTabId = IVar9;
    }
    local_bc = 0x500003;
    IVar5 = 0x500003;
    if (((host_window->Collapsed & 1U) == 0) && (IVar5 = local_bc, bVar15 != false)) {
      IVar5 = 0x700003;
    }
    local_bc = IVar5;
    BeginTabBarEx(_focus_tab_id,(ImRect *)&window_menu_button_pos,local_bc,node);
    local_1c0 = (ImVec4 *)&window_n_1;
    do {
      ImVec4::ImVec4(local_1c0);
      local_1c0 = local_1c0 + 1;
    } while (local_1c0 != (ImVec4 *)&backup_style_cols[5].z);
    for (window_1._4_4_ = 0; window_1._4_4_ < 6; window_1._4_4_ = window_1._4_4_ + 1) {
      pIVar13 = (pIVar4->Style).Colors + GWindowDockStyleColors[window_1._4_4_];
      fVar3 = pIVar13->y;
      (&window_n_1 + (long)window_1._4_4_ * 4)[0] = (int)pIVar13->x;
      (&window_n_1 + (long)window_1._4_4_ * 4)[1] = (int)fVar3;
      fVar3 = pIVar13->w;
      backup_style_cols[window_1._4_4_].x = pIVar13->z;
      backup_style_cols[window_1._4_4_].y = fVar3;
    }
    node->VisibleWindow = (ImGuiWindow *)0x0;
    for (window_1._0_4_ = 0; (int)window_1 < (node->Windows).Size;
        window_1._0_4_ = (int)window_1 + 1) {
      ppIVar11 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,(int)window_1);
      _color_n_1 = *ppIVar11;
      if ((((((uVar1 >> 0xe & 1) == 0 || !bVar14) && ((uint)local_19a != _color_n_1->ID)) ||
           ((_color_n_1->HasCloseButton & 1U) == 0)) || ((_color_n_1->Flags & 0x100000U) != 0)) &&
         ((pIVar4->FrameCount <= _color_n_1->LastFrameActive + 1 || (!bVar14)))) {
        local_13c = (_color_n_1->WindowClass).TabItemFlagsOverrideSet;
        if ((_color_n_1->Flags & 0x100000U) != 0) {
          local_13c = local_13c | 1;
        }
        if ((_focus_tab_id->Flags & 8U) != 0) {
          local_13c = local_13c | 4;
        }
        for (local_140 = 0; local_140 < 6; local_140 = local_140 + 1) {
          IVar16 = ColorConvertU32ToFloat4((_color_n_1->DockStyle).Colors[local_140]);
          pIVar13 = (pIVar4->Style).Colors + GWindowDockStyleColors[local_140];
          _color_n_2 = IVar16._0_8_;
          pIVar13->x = (float)color_n_2;
          pIVar13->y = (float)uStack_14c;
          local_148 = IVar16._8_8_;
          pIVar13->z = (float)(undefined4)local_148;
          pIVar13->w = (float)local_148._4_4_;
          _color_n_2 = IVar16;
        }
        close_button_is_enabled = true;
        if ((_color_n_1->HasCloseButton & 1U) == 0) {
          local_1e8 = (bool *)0x0;
        }
        else {
          local_1e8 = &close_button_is_enabled;
        }
        TabItemEx(_focus_tab_id,_color_n_1->Name,local_1e8,local_13c,_color_n_1);
        if ((close_button_is_enabled & 1U) == 0) {
          node->WantCloseTabId = _color_n_1->ID;
        }
        if (_focus_tab_id->VisibleTabId == _color_n_1->ID) {
          node->VisibleWindow = _color_n_1;
        }
        _color_n_1->DockTabItemStatusFlags = (pIVar4->LastItemData).StatusFlags;
        (_color_n_1->DockTabItemRect).Min = (pIVar4->LastItemData).Rect.Min;
        (_color_n_1->DockTabItemRect).Max = (pIVar4->LastItemData).Rect.Max;
        if (((pIVar4->NavWindow != (ImGuiWindow *)0x0) &&
            (pIVar4->NavWindow->RootWindow == _color_n_1)) &&
           (((_color_n_1->DC).NavLayersActiveMask & 2U) == 0)) {
          host_window->NavLastIds[1] = _color_n_1->ID;
        }
      }
    }
    for (local_158 = 0; local_158 < 6; local_158 = local_158 + 1) {
      pIVar13 = (pIVar4->Style).Colors + GWindowDockStyleColors[local_158];
      iVar2 = (&window_n_1 + (long)local_158 * 4)[1];
      pIVar13->x = (float)(&window_n_1 + (long)local_158 * 4)[0];
      pIVar13->y = (float)iVar2;
      fVar3 = backup_style_cols[local_158].y;
      pIVar13->z = backup_style_cols[local_158].x;
      pIVar13->w = fVar3;
    }
    if ((node->VisibleWindow != (ImGuiWindow *)0x0) &&
       ((bVar15 != false || (pIVar10->VisibleWindow == (ImGuiWindow *)0x0)))) {
      pIVar10->VisibleWindow = node->VisibleWindow;
    }
    local_1e9 = 0;
    if (((*(ushort *)&node->field_0xbc >> 0xb & 1) != 0) &&
       (local_1e9 = 0, node->VisibleWindow != (ImGuiWindow *)0x0)) {
      local_1e9 = node->VisibleWindow->HasCloseButton;
    }
    local_159 = local_1e9 & 1;
    local_15a = (byte)((ushort)*(undefined2 *)&node->field_0xbc >> 0xb) & 1;
    if (local_15a != 0) {
      if (local_159 == 0) {
        PushItemFlag(4,true);
        ImVec4::ImVec4((ImVec4 *)&title_bar_id,1.0,1.0,1.0,0.4);
        local_16c = operator*((pIVar4->Style).Colors,(ImVec4 *)&title_bar_id);
        PushStyleColor(0,&local_16c);
      }
      IVar9 = ImGuiWindow::GetID(host_window,"#CLOSE",(char *)0x0);
      bVar15 = CloseButton(IVar9,(ImVec2 *)&window_n);
      if (bVar15) {
        *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc & 0xbfff | 0x4000;
        for (iStack_180 = 0; iStack_180 < (_focus_tab_id->Tabs).Size; iStack_180 = iStack_180 + 1) {
          pIVar12 = ImVector<ImGuiTabItem>::operator[](&_focus_tab_id->Tabs,iStack_180);
          TabBarCloseTab(_focus_tab_id,pIVar12);
        }
      }
      if ((local_159 & 1) == 0) {
        PopStyleColor(1);
        PopItemFlag();
      }
    }
    tab._4_4_ = ImGuiWindow::GetID(host_window,"#TITLEBAR",(char *)0x0);
    if (((pIVar4->HoveredId == 0) || (pIVar4->HoveredId == tab._4_4_)) ||
       (pIVar4->ActiveId == tab._4_4_)) {
      ButtonBehavior((ImRect *)&tab_bar_rect.Max,tab._4_4_,(bool *)0x0,(bool *)((long)&tab + 3),
                     0x1000);
      if (pIVar4->HoveredId == tab._4_4_) {
        (pIVar4->LastItemData).ID = tab._4_4_;
        SetItemAllowOverlap();
      }
      if ((tab._3_1_ & 1) != 0) {
        bVar15 = IsMouseClicked(0,false);
        if (bVar15) {
          fStack_58 = (float)_focus_tab_id->SelectedTabId;
        }
        pIVar12 = TabBarFindTabByID(_focus_tab_id,_focus_tab_id->SelectedTabId);
        if (pIVar12 != (ImGuiTabItem *)0x0) {
          if (pIVar12->Window == (ImGuiWindow *)0x0) {
            local_210 = node->HostWindow;
          }
          else {
            local_210 = pIVar12->Window;
          }
          StartMouseMovingWindowOrNode(local_210,node,false);
        }
      }
    }
    if (_focus_tab_id->NextSelectedTabId != 0) {
      fStack_58 = (float)_focus_tab_id->NextSelectedTabId;
    }
    if (((fStack_58 != 0.0) &&
        (pIVar12 = TabBarFindTabByID(_focus_tab_id,(ImGuiID)fStack_58),
        pIVar12 != (ImGuiTabItem *)0x0)) && (pIVar12->Window != (ImGuiWindow *)0x0)) {
      FocusWindow(pIVar12->Window);
      NavInitWindow(pIVar12->Window,false);
    }
    EndTabBar();
    PopID();
    bVar15 = ImGuiDockNode::IsDockSpace(node);
    if (!bVar15) {
      (host_window->DC).NavLayerCurrent = ImGuiNavLayer_Main;
      host_window->SkipItems = (bool)(bVar6 & 1);
    }
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdateTabBar(ImGuiDockNode* node, ImGuiWindow* host_window)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;

    const bool node_was_active = (node->LastFrameActive + 1 == g.FrameCount);
    const bool closed_all = node->WantCloseAll && node_was_active;
    const ImGuiID closed_one = node->WantCloseTabId && node_was_active;
    node->WantCloseAll = false;
    node->WantCloseTabId = 0;

    // Decide if we should use a focused title bar color
    bool is_focused = false;
    ImGuiDockNode* root_node = DockNodeGetRootNode(node);
    if (g.NavWindowingTarget)
        is_focused = (g.NavWindowingTarget->DockNode == node);
    else if (g.NavWindow && g.NavWindow->RootWindowForTitleBarHighlight == host_window->RootWindowDockTree && root_node->LastFocusedNodeId == node->ID)
        is_focused = true;

    // Hidden tab bar will show a triangle on the upper-left (in Begin)
    if (node->IsHiddenTabBar() || node->IsNoTabBar())
    {
        node->VisibleWindow = (node->Windows.Size > 0) ? node->Windows[0] : NULL;
        node->IsFocused = is_focused;
        if (is_focused)
            node->LastFrameFocused = g.FrameCount;
        if (node->VisibleWindow)
        {
            // Notify root of visible window (used to display title in OS task bar)
            if (is_focused || root_node->VisibleWindow == NULL)
                root_node->VisibleWindow = node->VisibleWindow;
            if (node->TabBar)
                node->TabBar->VisibleTabId = node->VisibleWindow->ID;
        }
        return;
    }

    // Move ourselves to the Menu layer (so we can be accessed by tapping Alt) + undo SkipItems flag in order to draw over the title bar even if the window is collapsed
    bool backup_skip_item = host_window->SkipItems;
    if (!node->IsDockSpace())
    {
        host_window->SkipItems = false;
        host_window->DC.NavLayerCurrent = ImGuiNavLayer_Menu;
    }

    // Use PushOverrideID() instead of PushID() to use the node id _without_ the host window ID.
    // This is to facilitate computing those ID from the outside, and will affect more or less only the ID of the collapse button, popup and tabs,
    // as docked windows themselves will override the stack with their own root ID.
    PushOverrideID(node->ID);
    ImGuiTabBar* tab_bar = node->TabBar;
    bool tab_bar_is_recreated = (tab_bar == NULL); // Tab bar are automatically destroyed when a node gets hidden
    if (tab_bar == NULL)
    {
        DockNodeAddTabBar(node);
        tab_bar = node->TabBar;
    }

    ImGuiID focus_tab_id = 0;
    node->IsFocused = is_focused;

    const ImGuiDockNodeFlags node_flags = node->MergedFlags;
    const bool has_window_menu_button = (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0 && (style.WindowMenuButtonPosition != ImGuiDir_None);

    // In a dock node, the Collapse Button turns into the Window Menu button.
    // FIXME-DOCK FIXME-OPT: Could we recycle popups id across multiple dock nodes?
    if (has_window_menu_button && IsPopupOpen("#WindowMenu"))
    {
        if (ImGuiID tab_id = DockNodeUpdateWindowMenu(node, tab_bar))
            focus_tab_id = tab_bar->NextSelectedTabId = tab_id;
        is_focused |= node->IsFocused;
    }

    // Layout
    ImRect title_bar_rect, tab_bar_rect;
    ImVec2 window_menu_button_pos;
    ImVec2 close_button_pos;
    DockNodeCalcTabBarLayout(node, &title_bar_rect, &tab_bar_rect, &window_menu_button_pos, &close_button_pos);

    // Submit new tabs, they will be added as Unsorted and sorted below based on relative DockOrder value.
    const int tabs_count_old = tab_bar->Tabs.Size;
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        ImGuiWindow* window = node->Windows[window_n];
        if (TabBarFindTabByID(tab_bar, window->ID) == NULL)
            TabBarAddTab(tab_bar, ImGuiTabItemFlags_Unsorted, window);
    }

    // Title bar
    if (is_focused)
        node->LastFrameFocused = g.FrameCount;
    ImU32 title_bar_col = GetColorU32(host_window->Collapsed ? ImGuiCol_TitleBgCollapsed : is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg);
    host_window->DrawList->AddRectFilled(title_bar_rect.Min, title_bar_rect.Max, title_bar_col, host_window->WindowRounding, ImDrawFlags_RoundCornersTop);

    // Docking/Collapse button
    if (has_window_menu_button)
    {
        if (CollapseButton(host_window->GetID("#COLLAPSE"), window_menu_button_pos, node)) // == DockNodeGetWindowMenuButtonId(node)
            OpenPopup("#WindowMenu");
        if (IsItemActive())
            focus_tab_id = tab_bar->SelectedTabId;
    }

    // If multiple tabs are appearing on the same frame, sort them based on their persistent DockOrder value
    int tabs_unsorted_start = tab_bar->Tabs.Size;
    for (int tab_n = tab_bar->Tabs.Size - 1; tab_n >= 0 && (tab_bar->Tabs[tab_n].Flags & ImGuiTabItemFlags_Unsorted); tab_n--)
    {
        // FIXME-DOCK: Consider only clearing the flag after the tab has been alive for a few consecutive frames, allowing late comers to not break sorting?
        tab_bar->Tabs[tab_n].Flags &= ~ImGuiTabItemFlags_Unsorted;
        tabs_unsorted_start = tab_n;
    }
    if (tab_bar->Tabs.Size > tabs_unsorted_start)
    {
        IMGUI_DEBUG_LOG_DOCKING("In node 0x%08X: %d new appearing tabs:%s\n", node->ID, tab_bar->Tabs.Size - tabs_unsorted_start, (tab_bar->Tabs.Size > tabs_unsorted_start + 1) ? " (will sort)" : "");
        for (int tab_n = tabs_unsorted_start; tab_n < tab_bar->Tabs.Size; tab_n++)
            IMGUI_DEBUG_LOG_DOCKING(" - Tab '%s' Order %d\n", tab_bar->Tabs[tab_n].Window->Name, tab_bar->Tabs[tab_n].Window->DockOrder);
        if (tab_bar->Tabs.Size > tabs_unsorted_start + 1)
            ImQsort(tab_bar->Tabs.Data + tabs_unsorted_start, tab_bar->Tabs.Size - tabs_unsorted_start, sizeof(ImGuiTabItem), TabItemComparerByDockOrder);
    }

    // Apply NavWindow focus back to the tab bar
    if (g.NavWindow && g.NavWindow->RootWindow->DockNode == node)
        tab_bar->SelectedTabId = g.NavWindow->RootWindow->ID;

    // Selected newly added tabs, or persistent tab ID if the tab bar was just recreated
    if (tab_bar_is_recreated && TabBarFindTabByID(tab_bar, node->SelectedTabId) != NULL)
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId = node->SelectedTabId;
    else if (tab_bar->Tabs.Size > tabs_count_old)
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId = tab_bar->Tabs.back().Window->ID;

    // Begin tab bar
    ImGuiTabBarFlags tab_bar_flags = ImGuiTabBarFlags_Reorderable | ImGuiTabBarFlags_AutoSelectNewTabs; // | ImGuiTabBarFlags_NoTabListScrollingButtons);
    tab_bar_flags |= ImGuiTabBarFlags_SaveSettings | ImGuiTabBarFlags_DockNode;
    if (!host_window->Collapsed && is_focused)
        tab_bar_flags |= ImGuiTabBarFlags_IsFocused;
    BeginTabBarEx(tab_bar, tab_bar_rect, tab_bar_flags, node);
    //host_window->DrawList->AddRect(tab_bar_rect.Min, tab_bar_rect.Max, IM_COL32(255,0,255,255));

    // Backup style colors
    ImVec4 backup_style_cols[ImGuiWindowDockStyleCol_COUNT];
    for (int color_n = 0; color_n < ImGuiWindowDockStyleCol_COUNT; color_n++)
        backup_style_cols[color_n] = g.Style.Colors[GWindowDockStyleColors[color_n]];

    // Submit actual tabs
    node->VisibleWindow = NULL;
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        ImGuiWindow* window = node->Windows[window_n];
        if ((closed_all || closed_one == window->ID) && window->HasCloseButton && !(window->Flags & ImGuiWindowFlags_UnsavedDocument))
            continue;
        if (window->LastFrameActive + 1 >= g.FrameCount || !node_was_active)
        {
            ImGuiTabItemFlags tab_item_flags = 0;
            tab_item_flags |= window->WindowClass.TabItemFlagsOverrideSet;
            if (window->Flags & ImGuiWindowFlags_UnsavedDocument)
                tab_item_flags |= ImGuiTabItemFlags_UnsavedDocument;
            if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
                tab_item_flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

            // Apply stored style overrides for the window
            for (int color_n = 0; color_n < ImGuiWindowDockStyleCol_COUNT; color_n++)
                g.Style.Colors[GWindowDockStyleColors[color_n]] = ColorConvertU32ToFloat4(window->DockStyle.Colors[color_n]);

            bool tab_open = true;
            TabItemEx(tab_bar, window->Name, window->HasCloseButton ? &tab_open : NULL, tab_item_flags, window);
            if (!tab_open)
                node->WantCloseTabId = window->ID;
            if (tab_bar->VisibleTabId == window->ID)
                node->VisibleWindow = window;

            // Store last item data so it can be queried with IsItemXXX functions after the user Begin() call
            window->DockTabItemStatusFlags = g.LastItemData.StatusFlags;
            window->DockTabItemRect = g.LastItemData.Rect;

            // Update navigation ID on menu layer
            if (g.NavWindow && g.NavWindow->RootWindow == window && (window->DC.NavLayersActiveMask & (1 << ImGuiNavLayer_Menu)) == 0)
                host_window->NavLastIds[1] = window->ID;
        }
    }

    // Restore style colors
    for (int color_n = 0; color_n < ImGuiWindowDockStyleCol_COUNT; color_n++)
        g.Style.Colors[GWindowDockStyleColors[color_n]] = backup_style_cols[color_n];

    // Notify root of visible window (used to display title in OS task bar)
    if (node->VisibleWindow)
        if (is_focused || root_node->VisibleWindow == NULL)
            root_node->VisibleWindow = node->VisibleWindow;

    // Close button (after VisibleWindow was updated)
    // Note that VisibleWindow may have been overrided by CTRL+Tabbing, so VisibleWindow->ID may be != from tab_bar->SelectedTabId
    const bool close_button_is_enabled = node->HasCloseButton && node->VisibleWindow && node->VisibleWindow->HasCloseButton;
    const bool close_button_is_visible = node->HasCloseButton;
    //const bool close_button_is_visible = close_button_is_enabled; // Most people would expect this behavior of not even showing the button (leaving a hole since we can't claim that space as other windows in the tba bar have one)
    if (close_button_is_visible)
    {
        if (!close_button_is_enabled)
        {
            PushItemFlag(ImGuiItemFlags_Disabled, true);
            PushStyleColor(ImGuiCol_Text, style.Colors[ImGuiCol_Text] * ImVec4(1.0f,1.0f,1.0f,0.4f));
        }
        if (CloseButton(host_window->GetID("#CLOSE"), close_button_pos))
        {
            node->WantCloseAll = true;
            for (int n = 0; n < tab_bar->Tabs.Size; n++)
                TabBarCloseTab(tab_bar, &tab_bar->Tabs[n]);
        }
        //if (IsItemActive())
        //    focus_tab_id = tab_bar->SelectedTabId;
        if (!close_button_is_enabled)
        {
            PopStyleColor();
            PopItemFlag();
        }
    }

    // When clicking on the title bar outside of tabs, we still focus the selected tab for that node
    // FIXME: TabItem use AllowItemOverlap so we manually perform a more specific test for now (hovered || held)
    ImGuiID title_bar_id = host_window->GetID("#TITLEBAR");
    if (g.HoveredId == 0 || g.HoveredId == title_bar_id || g.ActiveId == title_bar_id)
    {
        bool held;
        ButtonBehavior(title_bar_rect, title_bar_id, NULL, &held, ImGuiButtonFlags_AllowItemOverlap);
        if (g.HoveredId == title_bar_id)
        {
            // ImGuiButtonFlags_AllowItemOverlap + SetItemAllowOverlap() required for appending into dock node tab bar,
            // otherwise dragging window will steal HoveredId and amended tabs cannot get them.
            g.LastItemData.ID = title_bar_id;
            SetItemAllowOverlap();
        }
        if (held)
        {
            if (IsMouseClicked(0))
                focus_tab_id = tab_bar->SelectedTabId;

            // Forward moving request to selected window
            if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_bar->SelectedTabId))
                StartMouseMovingWindowOrNode(tab->Window ? tab->Window : node->HostWindow, node, false);
        }
    }

    // Forward focus from host node to selected window
    //if (is_focused && g.NavWindow == host_window && !g.NavWindowingTarget)
    //    focus_tab_id = tab_bar->SelectedTabId;

    // When clicked on a tab we requested focus to the docked child
    // This overrides the value set by "forward focus from host node to selected window".
    if (tab_bar->NextSelectedTabId)
        focus_tab_id = tab_bar->NextSelectedTabId;

    // Apply navigation focus
    if (focus_tab_id != 0)
        if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, focus_tab_id))
            if (tab->Window)
            {
                FocusWindow(tab->Window);
                NavInitWindow(tab->Window, false);
            }

    EndTabBar();
    PopID();

    // Restore SkipItems flag
    if (!node->IsDockSpace())
    {
        host_window->DC.NavLayerCurrent = ImGuiNavLayer_Main;
        host_window->SkipItems = backup_skip_item;
    }
}